

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

bool __thiscall cmFindBase::CheckForVariableInCache(cmFindBase *this)

{
  string *name;
  bool bVar1;
  CacheEntryType CVar2;
  char *pcVar3;
  cmState *this_00;
  char *pcVar4;
  string local_50;
  
  name = &this->VariableName;
  pcVar3 = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,name);
  if (pcVar3 != (char *)0x0) {
    this_00 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    pcVar4 = cmState::GetCacheEntryValue(this_00,name);
    bVar1 = cmSystemTools::IsNOTFOUND(pcVar3);
    if (bVar1) {
      if (pcVar4 != (char *)0x0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"HELPSTRING","");
        pcVar3 = cmState::GetCacheEntryProperty(this_00,name,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = "(none)";
        if (pcVar3 != (char *)0x0) {
          pcVar4 = pcVar3;
        }
        pcVar3 = (char *)(this->VariableDocumentation)._M_string_length;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&this->VariableDocumentation,0,pcVar3,(ulong)pcVar4)
        ;
      }
    }
    else if ((pcVar4 != (char *)0x0) &&
            (CVar2 = cmState::GetCacheEntryType(this_00,name), CVar2 == UNINITIALIZED)) {
      this->AlreadyInCacheWithoutMetaInfo = true;
    }
    if (!bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmFindBase::CheckForVariableInCache()
{
  if(const char* cacheValue =
     this->Makefile->GetDefinition(this->VariableName))
    {
    cmState* state = this->Makefile->GetState();
    const char* cacheEntry = state->GetCacheEntryValue(this->VariableName);
    bool found = !cmSystemTools::IsNOTFOUND(cacheValue);
    bool cached = cacheEntry ? true : false;
    if(found)
      {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the
      // original value.  Tell the subclass implementations to do
      // this.
      if(cached && state->GetCacheEntryType(this->VariableName)
                                            == cmState::UNINITIALIZED)
        {
        this->AlreadyInCacheWithoutMetaInfo = true;
        }
      return true;
      }
    else if(cached)
      {
      const char* hs = state->GetCacheEntryProperty(this->VariableName,
                                                     "HELPSTRING");
      this->VariableDocumentation = hs?hs:"(none)";
      }
    }
  return false;
}